

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_str.c
# Opt level: O1

arg_str * arg_strn(char *shortopts,char *longopts,char *datatype,int mincount,int maxcount,
                  char *glossary)

{
  arg_str *paVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (maxcount <= mincount) {
    maxcount = mincount;
  }
  paVar1 = (arg_str *)argtable3_xmalloc((long)maxcount * 8 + 0x70);
  (paVar1->hdr).flag = '\x02';
  (paVar1->hdr).shortopts = shortopts;
  (paVar1->hdr).longopts = longopts;
  pcVar2 = "<string>";
  if (datatype != (char *)0x0) {
    pcVar2 = datatype;
  }
  (paVar1->hdr).datatype = pcVar2;
  (paVar1->hdr).glossary = glossary;
  (paVar1->hdr).mincount = mincount;
  (paVar1->hdr).maxcount = maxcount;
  (paVar1->hdr).parent = paVar1;
  (paVar1->hdr).resetfn = arg_str_resetfn;
  (paVar1->hdr).scanfn = arg_str_scanfn;
  (paVar1->hdr).checkfn = arg_str_checkfn;
  (paVar1->hdr).errorfn = arg_str_errorfn;
  paVar1->sval = (char **)(paVar1 + 1);
  paVar1->count = 0;
  if (0 < maxcount) {
    uVar3 = 0;
    do {
      paVar1->sval[uVar3] = "";
      uVar3 = uVar3 + 1;
    } while ((uint)maxcount != uVar3);
  }
  return paVar1;
}

Assistant:

struct arg_str* arg_strn(const char* shortopts, const char* longopts, const char* datatype, int mincount, int maxcount, const char* glossary) {
    size_t nbytes;
    struct arg_str* result;
    int i;

    /* should not allow this stupid error */
    /* we should return an error code warning this logic error */
    /* foolproof things by ensuring maxcount is not less than mincount */
    maxcount = (maxcount < mincount) ? mincount : maxcount;

    nbytes = sizeof(struct arg_str)      /* storage for struct arg_str */
             + (size_t)maxcount * sizeof(char*); /* storage for sval[maxcount] array */

    result = (struct arg_str*)xmalloc(nbytes);

    /* init the arg_hdr struct */
    result->hdr.flag = ARG_HASVALUE;
    result->hdr.shortopts = shortopts;
    result->hdr.longopts = longopts;
    result->hdr.datatype = datatype ? datatype : "<string>";
    result->hdr.glossary = glossary;
    result->hdr.mincount = mincount;
    result->hdr.maxcount = maxcount;
    result->hdr.parent = result;
    result->hdr.resetfn = (arg_resetfn*)arg_str_resetfn;
    result->hdr.scanfn = (arg_scanfn*)arg_str_scanfn;
    result->hdr.checkfn = (arg_checkfn*)arg_str_checkfn;
    result->hdr.errorfn = (arg_errorfn*)arg_str_errorfn;

    /* store the sval[maxcount] array immediately after the arg_str struct */
    result->sval = (const char**)(result + 1);
    result->count = 0;

    /* foolproof the string pointers by initializing them to reference empty strings */
    for (i = 0; i < maxcount; i++)
        result->sval[i] = "";

    ARG_TRACE(("arg_strn() returns %p\n", result));
    return result;
}